

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O0

void __thiscall Arcflow::reduce_redundancy(Arcflow *this)

{
  runtime_error *this_00;
  reference pvVar1;
  vector<Arc,_std::allocator<Arc>_> *this_01;
  __normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_> local_1a8;
  const_iterator local_1a0;
  vector<int,_std::allocator<int>_> *local_198;
  Arc *local_190;
  __normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_> local_188;
  __normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_> local_180;
  const_iterator local_178;
  vector<int,_std::allocator<int>_> *local_170;
  Arc *local_168;
  __normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_> local_160;
  anon_class_8_1_a8b54799_for__M_comp local_158;
  anon_class_8_1_a8b54799_for__M_comp comp_equal;
  anon_class_8_1_a8b54799 comp_less;
  undefined1 local_140 [4];
  int i;
  vector<int,_std::allocator<int>_> types;
  char local_118 [8];
  char _error_msg_ [256];
  Arcflow *this_local;
  
  if ((this->ready & 1U) != 0) {
    snprintf(local_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x1a5);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,local_118);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_140);
  for (comp_less.types._4_4_ = 0; comp_less.types._4_4_ < (this->inst).nsizes;
      comp_less.types._4_4_ = comp_less.types._4_4_ + 1) {
    pvVar1 = std::vector<Item,_std::allocator<Item>_>::operator[]
                       (&this->sitems,(long)comp_less.types._4_4_);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_140,&pvVar1->type);
  }
  comp_less.types._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_140,(value_type *)&comp_less);
  local_158.types = (vector<int,_std::allocator<int>_> *)local_140;
  comp_equal.types = local_158.types;
  local_160._M_current = (Arc *)std::vector<Arc,_std::allocator<Arc>_>::begin(&this->A);
  local_168 = (Arc *)std::vector<Arc,_std::allocator<Arc>_>::end(&this->A);
  local_170 = comp_equal.types;
  std::
  sort<__gnu_cxx::__normal_iterator<Arc*,std::vector<Arc,std::allocator<Arc>>>,Arcflow::reduce_redundancy()::__0>
            (local_160,(__normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_>)local_168,
             (anon_class_8_1_a8b54799)comp_equal.types);
  this_01 = &this->A;
  local_188._M_current = (Arc *)std::vector<Arc,_std::allocator<Arc>_>::begin(this_01);
  local_190 = (Arc *)std::vector<Arc,_std::allocator<Arc>_>::end(this_01);
  local_198 = local_158.types;
  local_180 = std::
              unique<__gnu_cxx::__normal_iterator<Arc*,std::vector<Arc,std::allocator<Arc>>>,Arcflow::reduce_redundancy()::__1>
                        (local_188,
                         (__normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_>)
                         local_190,local_158);
  __gnu_cxx::__normal_iterator<Arc_const*,std::vector<Arc,std::allocator<Arc>>>::
  __normal_iterator<Arc*>
            ((__normal_iterator<Arc_const*,std::vector<Arc,std::allocator<Arc>>> *)&local_178,
             &local_180);
  local_1a8._M_current = (Arc *)std::vector<Arc,_std::allocator<Arc>_>::end(&this->A);
  __gnu_cxx::__normal_iterator<Arc_const*,std::vector<Arc,std::allocator<Arc>>>::
  __normal_iterator<Arc*>
            ((__normal_iterator<Arc_const*,std::vector<Arc,std::allocator<Arc>>> *)&local_1a0,
             &local_1a8);
  std::vector<Arc,_std::allocator<Arc>_>::erase(this_01,local_178,local_1a0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_140);
  return;
}

Assistant:

void Arcflow::reduce_redundancy() {
	throw_assert(ready == false);
	// remove redundant parallel arcs
	std::vector<int> types;
	for (int i = 0; i < inst.nsizes; i++) {
		types.push_back(sitems[i].type);
	}
	types.push_back(-1);
	auto comp_less = [&types](const Arc &a, const Arc &b) {
		return (a.u < b.u) ||
			   (a.u == b.u && a.v < b.v) ||
			   (a.u == b.u && a.v == b.v && types[a.label] < types[b.label]);
	};
	auto comp_equal = [&types](const Arc &a, const Arc &b) {
		return a.u == b.u && a.v == b.v && types[a.label] == types[b.label];
	};
	sort(all(A), comp_less);
	A.erase(unique(all(A), comp_equal), A.end());
}